

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstrlib.c
# Opt level: O2

char * match(MatchState *ms,char *s,char *p)

{
  char cVar1;
  long lVar2;
  byte bVar3;
  int iVar4;
  uint uVar5;
  ushort **ppuVar6;
  char *pcVar7;
  char *pcVar8;
  ulong uVar9;
  ptrdiff_t *ppVar10;
  byte *s_00;
  bool bVar11;
  int iStack_40;
  
LAB_001165f3:
  s_00 = (byte *)s + 1;
LAB_001165fa:
  switch(*p) {
  case '$':
    if (p[1] == '\0') {
      if (s == ms->src_end) {
        return (char *)(byte *)s;
      }
      return (char *)0x0;
    }
    break;
  case '%':
    bVar3 = p[1];
    if ((ulong)bVar3 == 0x66) goto code_r0x00116627;
    if (bVar3 == 0x62) {
      bVar3 = p[2];
      if ((bVar3 == 0) || (p[3] == '\0')) {
        luaL_error(ms->L,"unbalanced pattern");
        bVar3 = p[2];
      }
      if (*s != bVar3) {
        return (char *)0x0;
      }
      iVar4 = 1;
      goto LAB_00116767;
    }
    ppuVar6 = __ctype_b_loc();
    if ((*(byte *)((long)*ppuVar6 + (ulong)bVar3 * 2 + 1) & 8) == 0) break;
    if (((bVar3 < 0x31) || (uVar5 = bVar3 - 0x31, ms->level <= (int)uVar5)) ||
       (ms->capture[uVar5].len == -1)) {
      uVar5 = luaL_error(ms->L,"invalid capture index");
    }
    uVar9 = ms->capture[(int)uVar5].len;
    if ((ulong)((long)ms->src_end - (long)s) < uVar9) {
      return (char *)0x0;
    }
    iVar4 = bcmp(ms->capture[(int)uVar5].init,s,uVar9);
    if (iVar4 != 0) {
      return (char *)0x0;
    }
    if ((byte *)s == (byte *)0x0) {
      return (char *)0x0;
    }
    s = (char *)((byte *)s + uVar9);
    p = p + 2;
    goto LAB_001165f3;
  case '&':
  case '\'':
    break;
  case '(':
    if (p[1] == ')') {
      pcVar7 = p + 2;
      iStack_40 = -2;
    }
    else {
      pcVar7 = p + 1;
      iStack_40 = -1;
    }
    pcVar7 = start_capture(ms,s,pcVar7,iStack_40);
    return pcVar7;
  case ')':
    uVar9 = (ulong)(uint)ms->level;
    ppVar10 = &ms->capture[uVar9 - 1].len;
    goto LAB_00116884;
  default:
    if (*p == '\0') {
      return (char *)(byte *)s;
    }
  }
  pcVar7 = classend(ms,p);
  if (s < ms->src_end) {
    iVar4 = singlematch((uint)(byte)*s,p,pcVar7);
    bVar11 = iVar4 != 0;
  }
  else {
    bVar11 = false;
  }
  cVar1 = *pcVar7;
  if (cVar1 == '?') {
    if ((bVar11) && (pcVar8 = match(ms,(char *)s_00,pcVar7 + 1), pcVar8 != (char *)0x0)) {
      return pcVar8;
    }
    p = pcVar7 + 1;
    goto LAB_001165fa;
  }
  if (cVar1 != '*') {
    if (cVar1 != '+') {
      if (cVar1 == '-') {
        while( true ) {
          pcVar8 = match(ms,s,pcVar7 + 1);
          if (pcVar8 != (char *)0x0) {
            return pcVar8;
          }
          if (ms->src_end <= s) break;
          iVar4 = singlematch((uint)(byte)*s,p,pcVar7);
          s = (char *)((byte *)s + 1);
          if (iVar4 == 0) {
            return (char *)0x0;
          }
        }
        return (char *)0x0;
      }
      if (!bVar11) {
        return (char *)0x0;
      }
      s = (char *)((byte *)s + 1);
      p = pcVar7;
      goto LAB_001165f3;
    }
    if (!bVar11) {
      return (char *)0x0;
    }
    s = (char *)((byte *)s + 1);
  }
  pcVar7 = max_expand(ms,s,p,pcVar7);
  return pcVar7;
code_r0x00116627:
  if (p[2] != '[') {
    luaL_error(ms->L,"missing \'[\' after \'%%f\' in pattern");
  }
  pcVar7 = p + 2;
  p = classend(ms,pcVar7);
  if (s == ms->src_init) {
    uVar5 = 0;
  }
  else {
    uVar5 = (uint)((byte *)s)[-1];
  }
  iVar4 = matchbracketclass(uVar5,pcVar7,p + -1);
  if (iVar4 != 0) {
    return (char *)0x0;
  }
  iVar4 = matchbracketclass((uint)(byte)*s,pcVar7,p + -1);
  if (iVar4 == 0) {
    return (char *)0x0;
  }
  goto LAB_001165fa;
LAB_00116767:
  if (ms->src_end <= s_00) {
    return (char *)0x0;
  }
  if (*s_00 == p[3]) {
    iVar4 = iVar4 + -1;
    if (iVar4 == 0) goto LAB_001167bb;
  }
  else {
    iVar4 = iVar4 + (uint)(*s_00 == bVar3);
  }
  s_00 = s_00 + 1;
  goto LAB_00116767;
LAB_001167bb:
  s = (char *)(s_00 + 1);
  p = p + 4;
  goto LAB_001165f3;
  while( true ) {
    uVar5 = (int)uVar9 - 1;
    uVar9 = (ulong)uVar5;
    lVar2 = *ppVar10;
    ppVar10 = ppVar10 + -2;
    if (lVar2 == -1) break;
LAB_00116884:
    if ((int)uVar9 < 1) {
      uVar5 = luaL_error(ms->L,"invalid pattern capture");
      break;
    }
  }
  ms->capture[(int)uVar5].len = (long)s - (long)ms->capture[(int)uVar5].init;
  pcVar7 = match(ms,s,p + 1);
  if (pcVar7 == (char *)0x0) {
    ms->capture[(int)uVar5].len = -1;
    return (char *)0x0;
  }
  return pcVar7;
}

Assistant:

static const char *match (MatchState *ms, const char *s, const char *p) {
  init: /* using goto's to optimize tail recursion */
  switch (*p) {
    case '(': {  /* start capture */
      if (*(p+1) == ')')  /* position capture? */
        return start_capture(ms, s, p+2, CAP_POSITION);
      else
        return start_capture(ms, s, p+1, CAP_UNFINISHED);
    }
    case ')': {  /* end capture */
      return end_capture(ms, s, p+1);
    }
    case L_ESC: {
      switch (*(p+1)) {
        case 'b': {  /* balanced string? */
          s = matchbalance(ms, s, p+2);
          if (s == NULL) return NULL;
          p+=4; goto init;  /* else return match(ms, s, p+4); */
        }
        case 'f': {  /* frontier? */
          const char *ep; char previous;
          p += 2;
          if (*p != '[')
            luaL_error(ms->L, "missing " LUA_QL("[") " after "
                               LUA_QL("%%f") " in pattern");
          ep = classend(ms, p);  /* points to what is next */
          previous = (s == ms->src_init) ? '\0' : *(s-1);
          if (matchbracketclass(uchar(previous), p, ep-1) ||
             !matchbracketclass(uchar(*s), p, ep-1)) return NULL;
          p=ep; goto init;  /* else return match(ms, s, ep); */
        }
        default: {
          if (isdigit(uchar(*(p+1)))) {  /* capture results (%0-%9)? */
            s = match_capture(ms, s, uchar(*(p+1)));
            if (s == NULL) return NULL;
            p+=2; goto init;  /* else return match(ms, s, p+2) */
          }
          goto dflt;  /* case default */
        }
      }
    }
    case '\0': {  /* end of pattern */
      return s;  /* match succeeded */
    }
    case '$': {
      if (*(p+1) == '\0')  /* is the `$' the last char in pattern? */
        return (s == ms->src_end) ? s : NULL;  /* check end of string */
      else goto dflt;
    }
    default: dflt: {  /* it is a pattern item */
      const char *ep = classend(ms, p);  /* points to what is next */
      int m = s<ms->src_end && singlematch(uchar(*s), p, ep);
      switch (*ep) {
        case '?': {  /* optional */
          const char *res;
          if (m && ((res=match(ms, s+1, ep+1)) != NULL))
            return res;
          p=ep+1; goto init;  /* else return match(ms, s, ep+1); */
        }
        case '*': {  /* 0 or more repetitions */
          return max_expand(ms, s, p, ep);
        }
        case '+': {  /* 1 or more repetitions */
          return (m ? max_expand(ms, s+1, p, ep) : NULL);
        }
        case '-': {  /* 0 or more repetitions (minimum) */
          return min_expand(ms, s, p, ep);
        }
        default: {
          if (!m) return NULL;
          s++; p=ep; goto init;  /* else return match(ms, s+1, ep); */
        }
      }
    }
  }
}